

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::TextNewline(CTextRender *this,CTextCursor *pCursor)

{
  int iVar1;
  int iVar2;
  IGraphics *pIVar3;
  long in_RSI;
  CTextRender *in_RDI;
  long in_FS_OFFSET;
  float NextAdvanceY;
  int PixelSize;
  float Size;
  int MaxLines;
  int ScreenHeight;
  int ScreenWidth;
  vec2 ScreenScale;
  float ScreenY1;
  float ScreenX1;
  float ScreenY0;
  float ScreenX0;
  int local_3c;
  vector2_base<float> local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(in_RSI + 0xc) & 1) == 0) && ((*(byte *)(in_RSI + 0x28) & 1) == 0)) {
    pIVar3 = Graphics(in_RDI);
    iVar1 = IGraphics::ScreenWidth(pIVar3);
    pIVar3 = Graphics(in_RDI);
    iVar2 = IGraphics::ScreenHeight(pIVar3);
    pIVar3 = Graphics(in_RDI);
    (*(pIVar3->super_IInterface)._vptr_IInterface[6])(pIVar3,&local_c,&local_10,&local_14,&local_18)
    ;
    local_3c = *(int *)(in_RSI + 0x4c);
    if (local_3c < 0) {
      local_3c = (int)((local_18 - local_10) / *(float *)(in_RSI + 0x48));
    }
    if (*(int *)(in_RSI + 0x10) < local_3c) {
      vector2_base<float>::vector2_base
                (&local_20,(float)iVar1 / (local_14 - local_c),(float)iVar2 / (local_18 - local_10))
      ;
      *(int *)(in_RSI + 0x10) = *(int *)(in_RSI + 0x10) + 1;
      *(float *)(in_RSI + 0x24) = *(float *)(in_RSI + 0x5c) + *(float *)(in_RSI + 0x2c);
      *(undefined4 *)(in_RSI + 0x20) = 0;
      *(undefined1 *)(in_RSI + 0x60) = 1;
      *(float *)(in_RSI + 0x2c) =
           (float)(int)((*(float *)(in_RSI + 0x24) + *(float *)(in_RSI + 0x48)) * local_20.field_1.y
                       ) / local_20.field_1.y;
    }
    else {
      *(int *)(in_RSI + 0x10) = local_3c;
      *(undefined1 *)(in_RSI + 0xc) = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTextRender::TextNewline(CTextCursor *pCursor)
{
	if(pCursor->m_Truncated || pCursor->m_SkipTextRender)
		return;

	// Alignment
	float ScreenX0, ScreenY0, ScreenX1, ScreenY1;
	int ScreenWidth = Graphics()->ScreenWidth();
	int ScreenHeight = Graphics()->ScreenHeight();
	Graphics()->GetScreen(&ScreenX0, &ScreenY0, &ScreenX1, &ScreenY1);

	int MaxLines = pCursor->m_MaxLines;
	if(MaxLines < 0)
		MaxLines = (ScreenY1-ScreenY0) / pCursor->m_FontSize;

	if(pCursor->m_LineCount >= MaxLines)
	{
		pCursor->m_LineCount = MaxLines;
		pCursor->m_Truncated = true;
		return;
	}

	vec2 ScreenScale = vec2(ScreenWidth/(ScreenX1-ScreenX0), ScreenHeight/(ScreenY1-ScreenY0));
	float Size = pCursor->m_FontSize;
	int PixelSize = (int)(Size * ScreenScale.y);
	Size = PixelSize / ScreenScale.y;

	pCursor->m_LineCount++;
	pCursor->m_Advance.y = pCursor->m_LineSpacing + pCursor->m_NextLineAdvanceY;
	pCursor->m_Advance.x = 0;
	pCursor->m_StartOfLine = true;
	float NextAdvanceY = pCursor->m_Advance.y + pCursor->m_FontSize;
	NextAdvanceY = (int)(NextAdvanceY * ScreenScale.y) / ScreenScale.y;
	pCursor->m_NextLineAdvanceY = NextAdvanceY;
}